

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
::increase_size(Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
                *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t maxNumElementsAllowed;
  Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
  *this_local;
  
  if (this->mMask == 0) {
    init_data(this,8);
  }
  else {
    sVar2 = calcMaxNumElementsAllowed(this,this->mMask + 1);
    if ((sVar2 <= this->mNumElements) || (bVar1 = try_increase_info(this), !bVar1)) {
      sVar2 = this->mNumElements;
      sVar3 = calcMaxNumElementsAllowed(this,this->mMask + 1);
      if (sVar2 << 1 < sVar3) {
        throwOverflowError(this);
      }
      rehashPowerOfTwo(this,(this->mMask + 1) * 2);
    }
  }
  return;
}

Assistant:

void increase_size() {
        // nothing allocated yet? just allocate InitialNumElements
        if (0 == mMask) {
            init_data(InitialNumElements);
            return;
        }

        auto const maxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        if (mNumElements < maxNumElementsAllowed && try_increase_info()) {
            return;
        }

        ROBIN_HOOD_LOG("mNumElements=" << mNumElements << ", maxNumElementsAllowed="
                                       << maxNumElementsAllowed << ", load="
                                       << (static_cast<double>(mNumElements) * 100.0 /
                                           (static_cast<double>(mMask) + 1)))
        // it seems we have a really bad hash function! don't try to resize again
        if (mNumElements * 2 < calcMaxNumElementsAllowed(mMask + 1)) {
            throwOverflowError();
        }

        rehashPowerOfTwo((mMask + 1) * 2);
    }